

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  string buffer;
  path input_name;
  push_parser<printing_callbacks> parser;
  reader reader;
  ifstream input;
  long *local_510;
  const_pointer local_508;
  long local_500 [2];
  istream_iterator<char,_char,_std::char_traits<char>,_long> local_4f0;
  path local_4e0;
  push_parser<printing_callbacks> local_4c0;
  basic_reader<char> local_370;
  undefined1 local_228 [25];
  byte abStack_20f [7];
  byte abStack_208 [224];
  undefined8 local_128 [33];
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,argv[1],(allocator<char> *)local_228);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              ((basic_ifstream<char,_std::char_traits<char>_> *)local_228,&local_4e0);
    if ((abStack_208[(long)*(_func_int **)(local_228._0_8_ + -0x18)] & 5) == 0) {
      abStack_20f[(long)*(_func_int **)(local_228._0_8_ + -0x18)] =
           abStack_20f[(long)*(_func_int **)(local_228._0_8_ + -0x18)] & 0xef;
      local_4f0._M_ok = true;
      local_4f0._M_stream = (istream_type *)local_228;
      std::istream_iterator<char,_char,_std::char_traits<char>,_long>::_M_read(&local_4f0);
      local_4c0.reader.decoder.input.head = (const_pointer)local_4f0._M_stream;
      local_4c0.reader.decoder.input.tail =
           (const_pointer)CONCAT62(local_4c0.reader.decoder.input.tail._2_6_,local_4f0._8_2_);
      local_370.decoder.input.head = (const_pointer)0x0;
      local_370.decoder.input.tail._0_2_ = 0;
      local_510 = local_500;
      std::__cxx11::string::
      _M_construct<std::istream_iterator<char,char,std::char_traits<char>,long>>
                ((string *)&local_510);
      local_4c0.reader.decoder.input.head = local_508;
      local_4c0.reader.decoder.input.tail = (const_pointer)local_510;
      trial::protocol::json::basic_reader<char>::basic_reader(&local_370,(view_type *)&local_4c0);
      memcpy((view_type *)&local_4c0,&local_370,0x130);
      std::
      vector<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ::vector(&local_4c0.reader.stack.c,&local_370.stack.c);
      example::push_parser<printing_callbacks>::parse(&local_4c0);
      if (local_4c0.reader.stack.c.
          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4c0.reader.stack.c.
                        super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4c0.reader.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4c0.reader.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_370.stack.c.
          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_370.stack.c.
                        super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_370.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_370.stack.c.
                              super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_510 != local_500) {
        operator_delete(local_510,local_500[0] + 1);
      }
    }
    local_228._0_8_ =
         std::ifstream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
         construction_vtable + 0x18;
    local_128[0] = 0x10cc50;
    std::filebuf::~filebuf((filebuf *)(local_228 + 0x10));
    local_228._0_8_ =
         std::istream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
         construction_vtable + 0x18;
    local_128[0] = 0x10cca0;
    local_228._8_8_ = 0;
    std::ios_base::~ios_base((ios_base *)local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0.m_pathname._M_dataplus._M_p != &local_4e0.m_pathname.field_2) {
      operator_delete(local_4e0.m_pathname._M_dataplus._M_p,
                      local_4e0.m_pathname.field_2._M_allocated_capacity + 1);
    }
    iVar2 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10e238);
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," <file>",7);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    iVar2 = 1;
    std::ostream::flush();
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    try
    {
        if (argc != 2)
        {
            std::cerr << "Usage: " << argv[0] << " <file>" << std::endl;
            return 1;
        }

        boost::filesystem::path input_name(argv[1]);
        boost::filesystem::ifstream input(input_name);
        if (input)
        {
            std::noskipws(input);
            std::string buffer((std::istream_iterator<char>(input)),
                               (std::istream_iterator<char>()));

            json::reader reader(buffer);
            example::push_parser<printing_callbacks> parser(reader);
            parser.parse();
        }
    }
    catch (const std::exception& ex)
    {
        std::cout << "Error: " << ex.what() << std::endl;
    }
    return 0;
}